

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateArray(ExpressionEvalContext *ctx,ExprArray *expression)

{
  uchar *puVar1;
  SynBase *source;
  bool bVar2;
  StackFrame **ppSVar3;
  ExprBase *pEVar4;
  ExprPointerLiteral *target_00;
  TypeArray *pTVar5;
  ExprPointerLiteral *this;
  TypeRef *type;
  ExprBase *load;
  ExprPointerLiteral *target;
  uchar *targetPtr;
  ExprBase *element;
  ExprBase *value;
  uint offset;
  TypeArray *arrayType;
  ExprPointerLiteral *storage;
  ExprArray *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::empty(&ctx->stackFrames);
  if ((!bVar2) &&
     (ppSVar3 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar3)->targetYield != 0)) {
    pEVar4 = &ExpressionContext::get<ExprVoid>(ctx->ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)pEVar4,(expression->super_ExprBase).source,ctx->ctx->typeVoid);
    return pEVar4;
  }
  bVar2 = AddInstruction(ctx);
  if (bVar2) {
    target_00 = AllocateTypeStorage(ctx,(expression->super_ExprBase).source,
                                    (expression->super_ExprBase).type);
    if (target_00 == (ExprPointerLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      pTVar5 = getType<TypeArray>((expression->super_ExprBase).type);
      if (pTVar5 == (TypeArray *)0x0) {
        __assert_fail("arrayType",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x3d5,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)");
      }
      value._4_4_ = 0;
      for (element = (expression->values).head; element != (ExprBase *)0x0; element = element->next)
      {
        pEVar4 = Evaluate(ctx,element);
        if (pEVar4 == (ExprBase *)0x0) {
          return (ExprBase *)0x0;
        }
        if (target_00->end < target_00->ptr + pTVar5->subType->size + (ulong)value._4_4_) {
          __assert_fail("storage->ptr + offset + arrayType->subType->size <= storage->end",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x3e0,"ExprBase *EvaluateArray(ExpressionEvalContext &, ExprArray *)");
        }
        puVar1 = target_00->ptr;
        this = ExpressionContext::get<ExprPointerLiteral>(ctx->ctx);
        source = (expression->super_ExprBase).source;
        type = ExpressionContext::GetReferenceType(ctx->ctx,pTVar5->subType);
        ExprPointerLiteral::ExprPointerLiteral
                  (this,source,&type->super_TypeBase,puVar1 + value._4_4_,
                   puVar1 + value._4_4_ + pTVar5->subType->size);
        bVar2 = CreateStore(ctx,&this->super_ExprBase,pEVar4);
        if (!bVar2) {
          return (ExprBase *)0x0;
        }
        value._4_4_ = (int)pTVar5->subType->size + value._4_4_;
      }
      pEVar4 = CreateLoad(ctx,&target_00->super_ExprBase);
      if (pEVar4 == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        ctx_local = (ExpressionEvalContext *)CheckType(&expression->super_ExprBase,pEVar4);
      }
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateArray(ExpressionEvalContext &ctx, ExprArray *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprPointerLiteral *storage = AllocateTypeStorage(ctx, expression->source, expression->type);

	if(!storage)
		return NULL;

	TypeArray *arrayType = getType<TypeArray>(expression->type);

	assert(arrayType);

	unsigned offset = 0;

	for(ExprBase *value = expression->values.head; value; value = value->next)
	{
		ExprBase *element = Evaluate(ctx, value);

		if(!element)
			return NULL;

		assert(storage->ptr + offset + arrayType->subType->size <= storage->end);

		unsigned char *targetPtr = storage->ptr + offset;

		ExprPointerLiteral *target = new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(arrayType->subType), targetPtr, targetPtr + arrayType->subType->size);

		if(!CreateStore(ctx, target, element))
			return NULL;

		offset += unsigned(arrayType->subType->size);
	}

	ExprBase *load = CreateLoad(ctx, storage);

	if(!load)
		return NULL;

	return CheckType(expression, load);
}